

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br_00;
  HuffmanCode **ppHVar1;
  HuffmanTablesSegment **decoded_data_00;
  ushort uVar2;
  uint uVar3;
  HuffmanTablesSegment *pHVar4;
  uint32_t uVar5;
  VP8LImageTransformType VVar6;
  int iVar7;
  uint32_t uVar8;
  HuffmanTablesSegment *pHVar9;
  int *mapping;
  uint32_t *data;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  VP8LBitReader *br;
  bool bVar16;
  uint32_t *huffman_image;
  uint32_t *local_58;
  ulong local_50;
  HuffmanTables *local_48;
  HTreeGroup *local_40;
  VP8LMetadata *local_38;
  
  br_00 = &dec->br_;
  local_38 = &dec->hdr_;
  if (is_level0 == 0) {
LAB_00109b51:
    bVar16 = true;
    uVar5 = VP8LReadBits(br_00,1);
    if (uVar5 == 0) goto LAB_00109b8a;
    uVar5 = VP8LReadBits(br_00,4);
    bVar16 = uVar5 - 1 < 0xb;
    uVar12 = (uint)bVar16;
    if (bVar16) goto LAB_00109b8d;
LAB_00109e22:
    if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  else {
    local_48 = (HuffmanTables *)dec->transforms_;
    do {
      uVar5 = VP8LReadBits(br_00,1);
      if (uVar5 == 0) goto LAB_00109b51;
      iVar13 = dec->next_transform_;
      VVar6 = VP8LReadBits(br_00,2);
      bVar16 = true;
      if ((dec->transforms_seen_ >> (VVar6 & 0x1f) & 1) == 0) {
        ppHVar1 = &(local_48->root).start + (long)iVar13 * 3;
        dec->transforms_seen_ = dec->transforms_seen_ | 1 << ((byte)VVar6 & 0x1f);
        *(VP8LImageTransformType *)ppHVar1 = VVar6;
        *(int *)(ppHVar1 + 1) = xsize;
        *(int *)((long)ppHVar1 + 0xc) = ysize;
        decoded_data_00 = (HuffmanTablesSegment **)(ppHVar1 + 2);
        ppHVar1[2] = (HuffmanCode *)0x0;
        dec->next_transform_ = dec->next_transform_ + 1;
        if (VVar6 < SUBTRACT_GREEN_TRANSFORM) {
          uVar5 = VP8LReadBits(br_00,3);
          bVar10 = (byte)(uVar5 + 2);
          *(uint32_t *)((long)ppHVar1 + 4) = uVar5 + 2;
          iVar13 = (1 << (bVar10 & 0x1f)) + -1;
          iVar13 = DecodeImageStream(*(uint32_t *)(ppHVar1 + 1) + iVar13 >> (bVar10 & 0x1f),
                                     (uint)(iVar13 + *(int *)((long)ppHVar1 + 0xc)) >>
                                     (bVar10 & 0x1f),0,dec,(uint32_t **)decoded_data_00);
          bVar16 = iVar13 == 0;
        }
        else if (VVar6 == COLOR_INDEXING_TRANSFORM) {
          uVar5 = VP8LReadBits(br_00,8);
          iVar13 = uVar5 + 1;
          uVar5 = 0;
          if ((iVar13 < 0x11) && (uVar5 = 1, iVar13 < 5)) {
            uVar5 = 2 < iVar13 ^ 3;
          }
          xsize = ((1 << (sbyte)uVar5) + *(uint32_t *)(ppHVar1 + 1)) - 1 >> (sbyte)uVar5;
          *(uint32_t *)((long)ppHVar1 + 4) = uVar5;
          iVar7 = DecodeImageStream(iVar13,1,0,dec,(uint32_t **)decoded_data_00);
          if (iVar7 != 0) {
            local_50 = 8L >> (*(byte *)((long)ppHVar1 + 4) & 0x3f);
            pHVar9 = (HuffmanTablesSegment *)WebPSafeMalloc(1L << ((byte)local_50 & 0x3f),4);
            if (pHVar9 != (HuffmanTablesSegment *)0x0) {
              pHVar4 = *decoded_data_00;
              *(uint32_t *)&pHVar9->start = *(uint32_t *)&pHVar4->start;
              uVar11 = 4;
              if (1 < iVar13) {
                uVar12 = iVar13 * 4;
                if (iVar13 * 4 < 6) {
                  uVar12 = 5;
                }
                uVar11 = 4;
                do {
                  *(char *)((long)&pHVar9->start + uVar11) =
                       *(char *)((long)pHVar9 + (uVar11 - 4)) +
                       *(char *)((long)&pHVar4->start + uVar11);
                  uVar11 = uVar11 + 1;
                } while (uVar12 != uVar11);
              }
              uVar12 = 4 << ((byte)local_50 & 0x1f);
              if ((uint)uVar11 < uVar12) {
                memset((void *)((long)&pHVar9->start + (uVar11 & 0xffffffff)),0,
                       (ulong)(uVar12 + ~(uint)uVar11) + 1);
              }
              WebPSafeFree(*decoded_data_00);
              *decoded_data_00 = pHVar9;
              if (pHVar9 != (HuffmanTablesSegment *)0x0) {
                bVar16 = false;
                goto LAB_00109b44;
              }
            }
            if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
              dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
            }
          }
        }
        else {
          bVar16 = false;
        }
      }
LAB_00109b44:
    } while (!bVar16);
    bVar16 = false;
LAB_00109b8a:
    uVar5 = 0;
LAB_00109b8d:
    if (bVar16) {
      local_48 = &(dec->hdr_).huffman_tables_;
      local_58 = (uint32_t *)0x0;
      local_40 = (HTreeGroup *)0x0;
      if ((is_level0 == 0) || (uVar8 = VP8LReadBits(br_00,1), uVar8 == 0)) {
        mapping = (int *)0x0;
        uVar12 = 1;
        uVar14 = 1;
LAB_00109d4a:
        bVar16 = true;
        if (((dec->br_).eos_ == 0) &&
           (iVar13 = ReadHuffmanCodesHelper(uVar5,uVar14,uVar12,mapping,dec,local_48,&local_40),
           iVar13 != 0)) {
          (dec->hdr_).huffman_image_ = local_58;
          (dec->hdr_).num_htree_groups_ = uVar14;
          (dec->hdr_).htree_groups_ = local_40;
          uVar12 = 1;
          bVar16 = false;
        }
        else {
          uVar12 = 0;
        }
      }
      else {
        local_50 = CONCAT44(local_50._4_4_,uVar5);
        uVar5 = VP8LReadBits(br_00,3);
        bVar10 = (byte)(uVar5 + 2);
        iVar13 = 1 << (bVar10 & 0x1f);
        uVar12 = 1;
        uVar15 = (xsize + iVar13) - 1U >> (bVar10 & 0x1f);
        uVar14 = (ysize + iVar13) - 1U >> (bVar10 & 0x1f);
        iVar13 = DecodeImageStream(uVar15,uVar14,0,dec,&local_58);
        if (iVar13 == 0) {
LAB_00109d3d:
          mapping = (int *)0x0;
          uVar14 = 1;
          bVar16 = false;
        }
        else {
          uVar15 = uVar15 * uVar14;
          (dec->hdr_).huffman_subsample_bits_ = uVar5 + 2;
          if ((int)uVar15 < 1) {
            uVar12 = 1;
          }
          else {
            uVar12 = 1;
            uVar11 = 0;
            do {
              uVar2 = *(ushort *)((long)local_58 + uVar11 * 4 + 1);
              local_58[uVar11] = (uint)uVar2;
              if (uVar12 <= uVar2) {
                uVar12 = uVar2 + 1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          bVar16 = true;
          if ((uVar12 < 0x3e9) && ((int)uVar12 <= xsize * ysize)) {
            mapping = (int *)0x0;
            uVar14 = uVar12;
          }
          else {
            mapping = (int *)WebPSafeMalloc((ulong)uVar12,4);
            if (mapping == (int *)0x0) {
              if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
                dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
              }
              goto LAB_00109d3d;
            }
            memset(mapping,0xff,(ulong)uVar12 << 2);
            if ((int)uVar15 < 1) {
              uVar14 = 0;
            }
            else {
              uVar11 = 0;
              uVar14 = 0;
              do {
                uVar3 = local_58[uVar11];
                if (mapping[uVar3] == -1) {
                  mapping[uVar3] = uVar14;
                  uVar14 = uVar14 + 1;
                }
                local_58[uVar11] = mapping[uVar3];
                uVar11 = uVar11 + 1;
              } while (uVar15 != uVar11);
            }
          }
        }
        uVar5 = (uint32_t)local_50;
        if (bVar16) goto LAB_00109d4a;
        bVar16 = true;
        uVar12 = 0;
      }
      WebPSafeFree(mapping);
      if (bVar16) {
        WebPSafeFree(local_58);
        VP8LHuffmanTablesDeallocate(local_48);
        VP8LHtreeGroupsFree(local_40);
      }
    }
    else {
      uVar12 = 0;
    }
    if ((char)uVar12 == '\0') goto LAB_00109e22;
    if ((int)uVar5 < 1) {
      local_38->color_cache_size_ = 0;
LAB_00109e42:
      iVar13 = (dec->hdr_).huffman_subsample_bits_;
      bVar10 = (byte)iVar13;
      dec->width_ = xsize;
      dec->height_ = ysize;
      (dec->hdr_).huffman_xsize_ = ((1 << (bVar10 & 0x1f)) + xsize) - 1U >> (bVar10 & 0x1f);
      (dec->hdr_).huffman_mask_ = -(uint)(iVar13 == 0) | ~(-1 << (bVar10 & 0x1f));
      if (is_level0 == 0) {
        data = (uint32_t *)WebPSafeMalloc((long)ysize * (long)xsize,4);
        if (data == (uint32_t *)0x0) {
          if ((dec->status_ == VP8_STATUS_SUSPENDED) || (uVar12 = 0, dec->status_ == VP8_STATUS_OK))
          {
            dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
            uVar12 = 0;
          }
        }
        if (data != (uint32_t *)0x0) {
          uVar12 = 0;
          iVar13 = DecodeImageData(dec,data,xsize,ysize,ysize,(ProcessRowsFunc)0x0);
          if (iVar13 != 0) {
            uVar12 = (uint)((dec->br_).eos_ == 0);
          }
        }
        goto LAB_00109e9f;
      }
      dec->state_ = READ_HDR;
    }
    else {
      (dec->hdr_).color_cache_size_ = 1 << ((byte)uVar5 & 0x1f);
      iVar13 = VP8LColorCacheInit(&(dec->hdr_).color_cache_,uVar5);
      if (iVar13 != 0) goto LAB_00109e42;
      if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
        dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      }
      uVar12 = 0;
    }
  }
  data = (uint32_t *)0x0;
LAB_00109e9f:
  if (uVar12 == 0) {
    WebPSafeFree(data);
  }
  else {
    if (decoded_data != (uint32_t **)0x0) {
      *decoded_data = data;
    }
    dec->last_pixel_ = 0;
    if (is_level0 != 0) {
      return uVar12;
    }
  }
  ClearMetadata(local_38);
  return uVar12;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size_ = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache_, color_cache_bits)) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  } else {
    hdr->color_cache_size_ = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state_ = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      ok = VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos_;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel_ = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}